

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void write_parameter_file(char *fname)

{
  char cVar1;
  undefined *puVar2;
  undefined *puVar3;
  FILE *__s;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  int k;
  long lVar9;
  int k_1;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  long local_68;
  long local_50;
  long local_48;
  
  __s = fopen(fname,"w");
  if (__s != (FILE *)0x0) {
    fwrite("## RNAfold parameter file v2.0\n",0x1f,1,__s);
    fprintf(__s,"\n# %s\n","stack");
    fwrite("/*  CG    GC    GU    UG    AU    UA    @  */\n",0x2e,1,__s);
    for (lVar10 = 0; lVar10 != 0xe0; lVar10 = lVar10 + 0x20) {
      display_array((int *)((long)stack37[1] + lVar10 + 4),7,7,(FILE *)__s);
    }
    fprintf(__s,"\n# %s\n","stack_enthalpies");
    lVar10 = 1;
    fwrite("/*  CG    GC    GU    UG    AU    UA    @  */\n",0x2e,1,__s);
    for (lVar11 = 0; lVar11 != 0xe0; lVar11 = lVar11 + 0x20) {
      display_array((int *)((long)stackdH[1] + lVar11 + 4),7,7,(FILE *)__s);
    }
    fprintf(__s,"\n# %s\n","mismatch_hairpin");
    lVar11 = 0x2e41c4;
    for (; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_hairpin_enthalpies");
    lVar11 = 0x2e44e4;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_interior");
    lVar11 = 0x2e3b84;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_interior_enthalpies");
    lVar11 = 0x2e3ea4;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_interior_1n");
    lVar11 = 0x2e4e44;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_interior_1n_enthalpies");
    lVar11 = 0x2e5164;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_interior_23");
    lVar11 = 0x2e5484;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_interior_23_enthalpies");
    lVar11 = 0x2e57a4;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_multi");
    lVar11 = 0x2e4804;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_multi_enthalpies");
    lVar11 = 0x2e4b24;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_exterior");
    lVar11 = 0x2e5ac4;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","mismatch_exterior_enthalpies");
    lVar11 = 0x2e5de4;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 0x14) {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
      }
      lVar11 = lVar11 + 100;
    }
    fprintf(__s,"\n# %s\n","dangle5");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    for (lVar10 = 0x14; lVar10 != 0xa0; lVar10 = lVar10 + 0x14) {
      display_array((int *)((long)dangle5_37[0] + lVar10),5,5,(FILE *)__s);
    }
    fprintf(__s,"\n# %s\n","dangle5_enthalpies");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    for (lVar10 = 0x14; lVar10 != 0xa0; lVar10 = lVar10 + 0x14) {
      display_array((int *)((long)dangle5_dH[0] + lVar10),5,5,(FILE *)__s);
    }
    fprintf(__s,"\n# %s\n","dangle3");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    for (lVar10 = 0x14; lVar10 != 0xa0; lVar10 = lVar10 + 0x14) {
      display_array((int *)((long)dangle3_37[0] + lVar10),5,5,(FILE *)__s);
    }
    fprintf(__s,"\n# %s\n","dangle3_enthalpies");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    for (lVar10 = 0x14; lVar10 != 0xa0; lVar10 = lVar10 + 0x14) {
      display_array((int *)((long)dangle3_dH[0] + lVar10),5,5,(FILE *)__s);
    }
    fprintf(__s,"\n# %s\n","int11");
    lVar11 = 0x2e6df4;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      puVar2 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar10];
      lVar8 = lVar11;
      for (lVar6 = 1; lVar6 != 8; lVar6 = lVar6 + 1) {
        fprintf(__s,"/* %2s..%2s */\n",puVar2,(&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar6]);
        for (lVar12 = 0; lVar12 != 100; lVar12 = lVar12 + 0x14) {
          display_array((int *)(lVar12 + lVar8),5,5,(FILE *)__s);
        }
        lVar8 = lVar8 + 100;
      }
      lVar11 = lVar11 + 800;
    }
    fprintf(__s,"\n# %s\n","int11_enthalpies");
    lVar11 = 0x2e86f4;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      puVar2 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar10];
      lVar8 = lVar11;
      for (lVar6 = 1; lVar6 != 8; lVar6 = lVar6 + 1) {
        fprintf(__s,"/* %2s..%2s */\n",puVar2,(&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar6]);
        for (lVar12 = 0; lVar12 != 100; lVar12 = lVar12 + 0x14) {
          display_array((int *)(lVar8 + lVar12),5,5,(FILE *)__s);
        }
        lVar8 = lVar8 + 100;
      }
      lVar11 = lVar11 + 800;
    }
    fprintf(__s,"\n# %s\n","int21");
    local_68 = 0x2eae04;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      puVar2 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar10];
      lVar6 = local_68;
      for (lVar11 = 1; lVar11 != 8; lVar11 = lVar11 + 1) {
        puVar3 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar11];
        lVar8 = lVar6;
        for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
          fprintf(__s,"/* %2s.%c..%2s */\n",puVar2,(ulong)(uint)(int)(char)(&DAT_002d836a)[lVar12],
                  puVar3);
          for (lVar13 = 0; lVar13 != 100; lVar13 = lVar13 + 0x14) {
            display_array((int *)(lVar13 + lVar8),5,5,(FILE *)__s);
          }
          lVar8 = lVar8 + 100;
        }
        lVar6 = lVar6 + 500;
      }
      local_68 = local_68 + 4000;
    }
    fprintf(__s,"\n# %s\n","int21_enthalpies");
    local_68 = 0x2f2b04;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      puVar2 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar10];
      lVar6 = local_68;
      for (lVar11 = 1; lVar11 != 8; lVar11 = lVar11 + 1) {
        puVar3 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar11];
        lVar8 = lVar6;
        for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
          fprintf(__s,"/* %2s.%c..%2s */\n",puVar2,(ulong)(uint)(int)(char)(&DAT_002d836a)[lVar12],
                  puVar3);
          for (lVar13 = 0; lVar13 != 100; lVar13 = lVar13 + 0x14) {
            display_array((int *)(lVar13 + lVar8),5,5,(FILE *)__s);
          }
          lVar8 = lVar8 + 100;
        }
        lVar6 = lVar6 + 500;
      }
      local_68 = local_68 + 4000;
    }
    fprintf(__s,"\n# %s\n","int22");
    local_50 = 0x2ff0c4;
    for (lVar10 = 1; lVar10 != 7; lVar10 = lVar10 + 1) {
      puVar2 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar10];
      local_48 = local_50;
      for (lVar11 = 1; lVar11 != 7; lVar11 = lVar11 + 1) {
        puVar3 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar11];
        lVar8 = local_48;
        for (lVar6 = 1; lVar6 != 5; lVar6 = lVar6 + 1) {
          cVar1 = (&DAT_002d836a)[lVar6];
          lVar13 = lVar8;
          for (lVar12 = 1; lVar12 != 5; lVar12 = lVar12 + 1) {
            fprintf(__s,"/* %2s.%c%c..%2s */\n",puVar2,(int)cVar1,
                    (ulong)(uint)(int)(char)(&DAT_002d836a)[lVar12],puVar3);
            for (lVar9 = 0; lVar9 != 0x50; lVar9 = lVar9 + 0x14) {
              display_array((int *)(lVar13 + lVar9),4,5,(FILE *)__s);
            }
            lVar13 = lVar13 + 100;
          }
          lVar8 = lVar8 + 500;
        }
        local_48 = local_48 + 0x9c4;
      }
      local_50 = local_50 + 20000;
    }
    fprintf(__s,"\n# %s\n","int22_enthalpies");
    local_50 = 0x3261c4;
    for (lVar10 = 1; lVar10 != 7; lVar10 = lVar10 + 1) {
      puVar2 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar10];
      local_48 = local_50;
      for (lVar11 = 1; lVar11 != 7; lVar11 = lVar11 + 1) {
        puVar3 = (&PTR_anon_var_dwarf_70e6c_002e2d00)[lVar11];
        lVar8 = local_48;
        for (lVar6 = 1; lVar6 != 5; lVar6 = lVar6 + 1) {
          cVar1 = (&DAT_002d836a)[lVar6];
          lVar13 = lVar8;
          for (lVar12 = 1; lVar12 != 5; lVar12 = lVar12 + 1) {
            fprintf(__s,"/* %2s.%c%c..%2s */\n",puVar2,(int)cVar1,
                    (ulong)(uint)(int)(char)(&DAT_002d836a)[lVar12],puVar3);
            for (lVar9 = 0; lVar9 != 0x50; lVar9 = lVar9 + 0x14) {
              display_array((int *)(lVar13 + lVar9),4,5,(FILE *)__s);
            }
            lVar13 = lVar13 + 100;
          }
          lVar8 = lVar8 + 500;
        }
        local_48 = local_48 + 0x9c4;
      }
      local_50 = local_50 + 20000;
    }
    fprintf(__s,"\n# %s\n","hairpin");
    display_array(hairpin37,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","hairpin_enthalpies");
    display_array(hairpindH,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","bulge");
    display_array(bulge37,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","bulge_enthalpies");
    display_array(bulgedH,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","interior");
    display_array(internal_loop37,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","interior_enthalpies");
    display_array(internal_loopdH,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","ML_params");
    fwrite("/* F = cu*n_unpaired + cc + ci*loop_degree (+TermAU) */\n",0x38,1,__s);
    fwrite("/*\t    cu\t cu_dH\t    cc\t cc_dH\t    ci\t ci_dH  */\n",0x31,1,__s);
    uVar5 = (ulong)(uint)ML_intern37;
    fprintf(__s,"\t%6d\t%6d\t%6d\t%6d\t%6d\t%6d\n",(ulong)(uint)ML_BASE37,(ulong)(uint)ML_BASEdH,
            (ulong)(uint)ML_closing37,(ulong)(uint)ML_closingdH,uVar5,(ulong)(uint)ML_interndH);
    fprintf(__s,"\n# %s\n","NINIO",uVar5);
    fprintf(__s,"/* Ninio = MIN(max, m*|n1-n2| */\n/*\t    m\t  m_dH     max  */\n\t%6d\t%6d\t%6d\n"
            ,(ulong)(uint)ninio37,(ulong)(uint)niniodH,(ulong)(uint)MAX_NINIO);
    fprintf(__s,"\n# %s\n","Misc");
    fwrite("/* all parameters are pairs of \'energy enthalpy\' */\n",0x34,1,__s);
    fwrite("/*    DuplexInit     TerminalAU      LXC */\n",0x2c,1,__s);
    uVar14 = 0;
    fprintf(__s,"   %6d %6d %6d  %6d %3.6f %6d\n",lxc37,(ulong)(uint)DuplexInit37,
            (ulong)(uint)DuplexInitdH,(ulong)(uint)TerminalAU37,(ulong)(uint)TerminalAUdH);
    fprintf(__s,"\n# %s\n","Hexaloops",uVar14);
    pcVar7 = Hexaloops;
    uVar5 = 0;
    while( true ) {
      sVar4 = strlen(Hexaloops);
      if (sVar4 / 9 <= uVar5) break;
      fprintf(__s,"\t%.8s %6d %6d\n",pcVar7,(ulong)(uint)Hexaloop37[uVar5],
              (ulong)(uint)HexaloopdH[uVar5]);
      uVar5 = uVar5 + 1;
      pcVar7 = pcVar7 + 9;
    }
    fprintf(__s,"\n# %s\n","Tetraloops");
    pcVar7 = Tetraloops;
    uVar5 = 0;
    while( true ) {
      sVar4 = strlen(Tetraloops);
      if (sVar4 / 7 <= uVar5) break;
      fprintf(__s,"\t%.6s %6d %6d\n",pcVar7,(ulong)(uint)Tetraloop37[uVar5],
              (ulong)(uint)TetraloopdH[uVar5]);
      uVar5 = uVar5 + 1;
      pcVar7 = pcVar7 + 7;
    }
    fprintf(__s,"\n# %s\n","Triloops");
    pcVar7 = Triloops;
    uVar5 = 0;
    while( true ) {
      sVar4 = strlen(Triloops);
      if (sVar4 / 6 <= uVar5) break;
      fprintf(__s,"\t%.5s %6d %6d\n",pcVar7,(ulong)(uint)Triloop37[uVar5],
              (ulong)(uint)TriloopdH[uVar5]);
      uVar5 = uVar5 + 1;
      pcVar7 = pcVar7 + 6;
    }
    fprintf(__s,"\n# %s\n","END");
    fclose(__s);
    return;
  }
  vrna_message_error("can\'t open file %s",fname);
  exit(1);
}

Assistant:

PUBLIC void
write_parameter_file(const char fname[])
{
  FILE  *outfp;
  int   c;
  char  *pnames[] = {
    "NP", "CG", "GC", "GU", "UG", "AU", "UA", " @"
  };
  char  bnames[] = "@ACGU";

  outfp = fopen(fname, "w");
  if (!outfp) {
    vrna_message_error("can't open file %s", fname);
    exit(1);
  }

  fprintf(outfp, "## RNAfold parameter file v2.0\n");

  fprintf(outfp, "\n# %s\n", settype(S));
  fprintf(outfp, "/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(stack37[c] + 1, NBPAIRS, NBPAIRS, outfp);

  fprintf(outfp, "\n# %s\n", settype(S_H));
  fprintf(outfp, "/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(stackdH[c] + 1, NBPAIRS, NBPAIRS, outfp);

  fprintf(outfp, "\n# %s\n", settype(MMH));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchH37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMH_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchHdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchI37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchIdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI1N));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch1nI37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI1N_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch1nIdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI23));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch23I37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI23_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch23IdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMM));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchM37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMM_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchMdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MME));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchExt37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MME_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchExtdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(D5));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle5_37[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D5_H));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle5_dH[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D3));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle3_37[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D3_H));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle3_dH[c], 5, 5, outfp);


  /* dont print "no pair" entries for interior loop arrays */
  fprintf(outfp, "\n# %s\n", settype(INT11));
  {
    int i, k, l;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (l = 1; l < NBPAIRS + 1; l++) {
        fprintf(outfp, "/* %2s..%2s */\n", pnames[k], pnames[l]);
        for (i = 0; i < 5; i++)
          display_array(int11_37[k][l][i], 5, 5, outfp);
      }
  }

  fprintf(outfp, "\n# %s\n", settype(INT11_H));
  {
    int i, k, l;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (l = 1; l < NBPAIRS + 1; l++) {
        fprintf(outfp, "/* %2s..%2s */\n", pnames[k], pnames[l]);
        for (i = 0; i < 5; i++)
          display_array(int11_dH[k][l][i], 5, 5, outfp);
      }
  }

  fprintf(outfp, "\n# %s\n", settype(INT21));
  {
    int p1, p2, i, j;
    for (p1 = 1; p1 < NBPAIRS + 1; p1++)
      for (p2 = 1; p2 < NBPAIRS + 1; p2++)
        for (i = 0; i < 5; i++) {
          fprintf(outfp, "/* %2s.%c..%2s */\n",
                  pnames[p1], bnames[i], pnames[p2]);
          for (j = 0; j < 5; j++)
            display_array(int21_37[p1][p2][i][j], 5, 5, outfp);
        }
  }

  fprintf(outfp, "\n# %s\n", settype(INT21_H));
  {
    int p1, p2, i, j;
    for (p1 = 1; p1 < NBPAIRS + 1; p1++)
      for (p2 = 1; p2 < NBPAIRS + 1; p2++)
        for (i = 0; i < 5; i++) {
          fprintf(outfp, "/* %2s.%c..%2s */\n",
                  pnames[p1], bnames[i], pnames[p2]);
          for (j = 0; j < 5; j++)
            display_array(int21_dH[p1][p2][i][j], 5, 5, outfp);
        }
  }

  fprintf(outfp, "\n# %s\n", settype(INT22));
  {
    int p1, p2, i, j, k;
    for (p1 = 1; p1 < NBPAIRS; p1++)
      for (p2 = 1; p2 < NBPAIRS; p2++)
        for (i = 1; i < 5; i++)
          for (j = 1; j < 5; j++) {
            fprintf(outfp, "/* %2s.%c%c..%2s */\n",
                    pnames[p1], bnames[i], bnames[j], pnames[p2]);
            for (k = 1; k < 5; k++)
              display_array(int22_37[p1][p2][i][j][k] + 1, 4, 5, outfp);
          }
  }

  fprintf(outfp, "\n# %s\n", settype(INT22_H));
  {
    int p1, p2, i, j, k;
    for (p1 = 1; p1 < NBPAIRS; p1++)
      for (p2 = 1; p2 < NBPAIRS; p2++)
        for (i = 1; i < 5; i++)
          for (j = 1; j < 5; j++) {
            fprintf(outfp, "/* %2s.%c%c..%2s */\n",
                    pnames[p1], bnames[i], bnames[j], pnames[p2]);
            for (k = 1; k < 5; k++)
              display_array(int22_dH[p1][p2][i][j][k] + 1, 4, 5, outfp);
          }
  }

  fprintf(outfp, "\n# %s\n", settype(HP));
  display_array(hairpin37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(HP_H));
  display_array(hairpindH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(B));
  display_array(bulge37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(B_H));
  display_array(bulgedH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(IL));
  display_array(internal_loop37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(IL_H));
  display_array(internal_loopdH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(ML));
  fprintf(outfp, "/* F = cu*n_unpaired + cc + ci*loop_degree (+TermAU) */\n");
  fprintf(outfp, "/*\t    cu\t cu_dH\t    cc\t cc_dH\t    ci\t ci_dH  */\n");
  fprintf(outfp,
          "\t%6d\t%6d\t%6d\t%6d\t%6d\t%6d\n",
          ML_BASE37,
          ML_BASEdH,
          ML_closing37,
          ML_closingdH,
          ML_intern37,
          ML_interndH);

  fprintf(outfp, "\n# %s\n", settype(NIN));
  fprintf(outfp, "/* Ninio = MIN(max, m*|n1-n2| */\n"
          "/*\t    m\t  m_dH     max  */\n"
          "\t%6d\t%6d\t%6d\n", ninio37, niniodH, MAX_NINIO);

  fprintf(outfp, "\n# %s\n", settype(MISC));
  fprintf(outfp, "/* all parameters are pairs of 'energy enthalpy' */\n");
  fprintf(outfp, "/*    DuplexInit     TerminalAU      LXC */\n");
  fprintf(outfp,
          "   %6d %6d %6d  %6d %3.6f %6d\n",
          DuplexInit37,
          DuplexInitdH,
          TerminalAU37,
          TerminalAUdH,
          lxc37,
          0);

  fprintf(outfp, "\n# %s\n", settype(HEX));
  for (c = 0; c < strlen(Hexaloops) / 9; c++)
    fprintf(outfp, "\t%.8s %6d %6d\n", Hexaloops + c * 9, Hexaloop37[c], HexaloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(TL));
  for (c = 0; c < strlen(Tetraloops) / 7; c++)
    fprintf(outfp, "\t%.6s %6d %6d\n", Tetraloops + c * 7, Tetraloop37[c], TetraloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(TRI));
  for (c = 0; c < strlen(Triloops) / 6; c++)
    fprintf(outfp, "\t%.5s %6d %6d\n", Triloops + c * 6, Triloop37[c], TriloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(QUIT));
  fclose(outfp);
}